

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_279991::LaneBasedExecutionQueue::LaneBasedExecutionQueue
          (LaneBasedExecutionQueue *this,ExecutionQueueDelegate *delegate,uint numLanesSuggestion,
          SchedulerAlgorithm alg,QualityOfService qos,char **environment)

{
  result_type rVar1;
  thread *this_00;
  LaneBasedExecutionQueue *local_13e8;
  code *local_13e0;
  undefined8 local_13d8;
  value_type local_13d0;
  uint local_13c4;
  uint uStack_13c0;
  uint i;
  pair<unsigned_int,_unsigned_int> taskLimits;
  char **environment_local;
  QualityOfService qos_local;
  SchedulerAlgorithm alg_local;
  uint numLanesSuggestion_local;
  ExecutionQueueDelegate *delegate_local;
  LaneBasedExecutionQueue *this_local;
  
  llbuild::basic::ExecutionQueue::ExecutionQueue(&this->super_ExecutionQueue,delegate);
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__LaneBasedExecutionQueue_003e20f0;
  std::random_device::random_device((random_device *)&taskLimits);
  rVar1 = std::random_device::operator()((random_device *)&taskLimits);
  std::random_device::~random_device((random_device *)&taskLimits);
  this->buildID = rVar1;
  std::
  vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
  ::vector(&this->lanes);
  this->qos = qos;
  Scheduler::make((Scheduler *)&this->readyJobs,alg);
  FifoScheduler::FifoScheduler(&this->readyPriorityJobs);
  std::mutex::mutex(&this->readyJobsMutex);
  std::condition_variable::condition_variable(&this->readyJobsCondition);
  this->cancelled = false;
  this->shutdown = false;
  llbuild::basic::ProcessGroup::ProcessGroup(&this->spawnedProcesses);
  std::mutex::mutex(&this->killAfterTimeoutThreadMutex);
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)
             &this->killAfterTimeoutThread,(nullptr_t)0x0);
  std::condition_variable::condition_variable(&this->queueCompleteCondition);
  std::mutex::mutex(&this->queueCompleteMutex);
  this->queueComplete = false;
  this->backgroundTaskMax = 0;
  std::atomic<unsigned_int>::atomic(&this->backgroundTaskCount,0);
  this->environment = environment;
  _uStack_13c0 = estimateTaskLimits(numLanesSuggestion);
  this->numLanes = uStack_13c0;
  this->backgroundTaskMax = i;
  for (local_13c4 = 0; local_13c4 != this->numLanes; local_13c4 = local_13c4 + 1) {
    this_00 = (thread *)operator_new(8);
    local_13e0 = executeLane;
    local_13d8 = 0;
    local_13e8 = this;
    std::thread::
    thread<void((anonymous_namespace)::LaneBasedExecutionQueue::*)(unsigned_int,unsigned_int),(anonymous_namespace)::LaneBasedExecutionQueue*,unsigned_int&,unsigned_int&,void>
              (this_00,(type *)&local_13e0,&local_13e8,&this->buildID,&local_13c4);
    std::unique_ptr<std::thread,std::default_delete<std::thread>>::
    unique_ptr<std::default_delete<std::thread>,void>
              ((unique_ptr<std::thread,std::default_delete<std::thread>> *)&local_13d0,this_00);
    std::
    vector<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>,_std::allocator<std::unique_ptr<std::thread,_std::default_delete<std::thread>_>_>_>
    ::push_back(&this->lanes,&local_13d0);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&local_13d0);
  }
  return;
}

Assistant:

LaneBasedExecutionQueue(ExecutionQueueDelegate& delegate,
                          unsigned numLanesSuggestion, SchedulerAlgorithm alg,
                          QualityOfService qos, const char* const* environment)
  : ExecutionQueue(delegate), buildID(std::random_device()()), qos(qos),
        readyJobs(Scheduler::make(alg)), environment(environment)
  {

    auto taskLimits = estimateTaskLimits(numLanesSuggestion);
    numLanes = taskLimits.first;
    backgroundTaskMax = taskLimits.second;

    for (unsigned i = 0; i != numLanes; ++i) {
      lanes.push_back(std::unique_ptr<std::thread>(
                          new std::thread(
                              &LaneBasedExecutionQueue::executeLane, this, buildID, i)));
    }
  }